

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

gpu_object * gpu_object_find(uint32_t cid,uint32_t handle)

{
  gpu_object *pgVar1;
  gpu_object **ppgVar2;
  
  ppgVar2 = &gpu_objects;
  while( true ) {
    pgVar1 = *ppgVar2;
    if ((pgVar1 == (gpu_object *)0x0) || ((pgVar1->cid == cid && (pgVar1->handle == handle))))
    break;
    ppgVar2 = &pgVar1->next;
  }
  return pgVar1;
}

Assistant:

struct gpu_object *gpu_object_find(uint32_t cid, uint32_t handle)
{
	struct gpu_object *obj;
	for (obj = gpu_objects; obj != NULL; obj = obj->next)
		if (obj->cid == cid && obj->handle == handle)
			return obj;
	return NULL;
}